

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

int s2pred::TriageCompareCosDistances<double>
              (Vector3<double> *x,Vector3<double> *a,Vector3<double> *b)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = a->c_[2] * x->c_[2] + a->c_[1] * x->c_[1] + a->c_[0] * x->c_[0] + 0.0;
  dVar4 = b->c_[2] * x->c_[2] + b->c_[1] * x->c_[1] + b->c_[0] * x->c_[0] + 0.0;
  dVar3 = dVar2 - dVar4;
  dVar2 = ABS(dVar4) * 1.0547118733938987e-15 + 1.6653345369377348e-16 +
          ABS(dVar2) * 1.0547118733938987e-15 + 1.6653345369377348e-16;
  uVar1 = 0xffffffff;
  if (dVar3 <= dVar2) {
    uVar1 = (uint)(dVar3 < -dVar2);
  }
  return uVar1;
}

Assistant:

static T Dot(T sum, const T* a, const T* b, absl::index_sequence<Is...>) {
    Ignore({(sum += a[Is] * b[Is], true)...});
    return sum;
  }